

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O1

void __thiscall
TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer puVar2;
  pointer puVar3;
  void *__s;
  void *pvVar4;
  value_type_conflict2 *__val;
  pointer *__ptr;
  char *message;
  ptrdiff_t _Num;
  database *this_01;
  size_t __n;
  undefined1 *puVar5;
  AssertionResult gtest_ar;
  extent<unsigned_char> t1;
  shared_ptr<const_unsigned_char> r;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer2;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_f8;
  AssertHelper local_e0;
  char local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  ulong local_b0;
  undefined8 local_a8;
  undefined1 *puStack_a0;
  undefined1 local_90 [16];
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> local_80;
  
  __s = operator_new(0x400001);
  puVar5 = (undefined1 *)0x0;
  memset(__s,0,0x400001);
  do {
    *(char *)((long)__s + (long)puVar5) = (char)puVar5;
    puVar5 = puVar5 + 1;
  } while (puVar5 != &DAT_00400001);
  local_a8 = 0;
  puStack_a0 = (undefined1 *)0x0;
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)(local_90 + 0x10),
                &(this->super_TwoConnections).first);
  puStack_a0 = &DAT_00400001;
  pstore::transaction_base::alloc_rw<unsigned_char,void>
            (&local_f8,(transaction_base *)(local_90 + 0x10),0x400001);
  this_00._M_pi =
       local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  peVar1 = local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  memcpy(peVar1,__s,0x400001);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  pstore::transaction_base::commit((transaction_base *)(local_90 + 0x10));
  local_80.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00272628;
  pstore::transaction_base::rollback((transaction_base *)(local_90 + 0x10));
  pstore::lock_guard<pstore::transaction_mutex>::~lock_guard(&local_80.lock_);
  this_01 = &(this->super_TwoConnections).second;
  pstore::database::sync(this_01);
  pstore::database::getro<unsigned_char,void>((database *)local_90,(extent<unsigned_char> *)this_01)
  ;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_90 + 0x10),
             (uchar *)local_90._0_8_,puStack_a0 + local_90._0_8_,(allocator_type *)&local_f8);
  pvVar4 = operator_new(0x400001);
  memcpy(pvVar4,__s,0x400001);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (&local_c8,0x400001);
  puVar2 = local_c8._M_impl.super__Vector_impl_data._M_start;
  memmove(local_c8._M_impl.super__Vector_impl_data._M_start,pvVar4,0x400001);
  local_c8._M_impl.super__Vector_impl_data._M_finish = puVar2 + 0x400001;
  operator_delete(pvVar4,0x400001);
  local_b0 = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8._M_impl.super__Vector_impl_data._M_start;
  if (local_b0 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    if ((long)local_b0 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar4 = operator_new(local_b0);
  }
  puVar3 = local_c8._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = local_c8._M_impl.super__Vector_impl_data._M_start;
  __n = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8._M_impl.super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(pvVar4,local_c8._M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.second.a_.a_ = (address)0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,__n);
  peVar1 = local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (puVar3 != puVar2) {
    memmove(local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            pvVar4,__n);
  }
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)peVar1 + __n);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_b0);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(local_d8,(char *)&local_f8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)"buffer2");
  if ((long *)local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (long *)0x0) {
    operator_delete(local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_f8.second.a_.a_ -
                           (long)local_f8.first.
                                 super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
  }
  if (local_c8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (long *)0x0) {
      (**(code **)(*(long *)local_f8.first.
                            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
                  ))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  if ((element_type *)local_80.super_transaction_base._vptr_transaction_base != (element_type *)0x0)
  {
    operator_delete(local_80.super_transaction_base._vptr_transaction_base,
                    local_80.super_transaction_base.size_ -
                    (long)local_80.super_transaction_base._vptr_transaction_base);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  operator_delete(__s,0x400001);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionMapsAdditionalSpace) {
    using ::testing::ContainerEq;

    // The first connection write > min_region_size bytes in a transaction.
    std::vector<std::uint8_t> buffer1 (pstore::storage::min_region_size + 1);
    std::iota (std::begin (buffer1), std::end (buffer1), std::uint8_t{0});

    pstore::extent<std::uint8_t> t1;
    {
        auto transaction = pstore::begin (first);
        {
            t1.size = buffer1.size ();
            std::shared_ptr<std::uint8_t> ptr;
            std::tie (ptr, t1.addr) = transaction.alloc_rw<std::uint8_t> (t1.size);
            std::memcpy (ptr.get (), buffer1.data (), buffer1.size ());
        }

        transaction.commit ();
    }

    second.sync ();
    auto r = second.getro (t1);
    std::vector<std::uint8_t> buffer2 (r.get (), r.get () + t1.size);
    EXPECT_THAT (buffer2, ContainerEq (buffer1));
}